

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O2

void __thiscall BMRS<TTA>::SecondScan(BMRS<TTA> *this)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Mat1i *pMVar5;
  uint64_t *puVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  long lVar10;
  int j;
  ulong uVar11;
  int j_1;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  Run *pRVar15;
  ulong uVar16;
  long local_50;
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar2 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  pRVar15 = (this->data_runs).runs;
  uVar14 = (long)(int)uVar2 / 2 & 0xffffffff;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  puVar6 = (this->data_compressed).bits;
  local_50 = 0;
  if ((int)((long)(int)uVar2 / 2) < 1) {
    uVar14 = 0;
  }
  lVar10 = 1;
  for (uVar16 = 0; puVar9 = TTA::rtable_, uVar16 != uVar14; uVar16 = uVar16 + 1) {
    iVar3 = (this->data_compressed).data_width;
    iVar12 = (int)uVar16 * iVar3;
    lVar7 = *(long *)&pMVar5->field_0x10;
    lVar8 = **(long **)&pMVar5->field_0x48;
    for (; uVar11 = (ulong)pRVar15->start_pos, uVar11 != 0xffff; pRVar15 = pRVar15 + 1) {
      uVar1 = pRVar15->end_pos;
      uVar4 = puVar9[pRVar15->label];
      for (; uVar11 < uVar1; uVar11 = uVar11 + 1) {
        uVar13 = uVar11 >> 6 & 0x3ffffff;
        if ((puVar6[(long)(iVar12 * 2) + uVar13] >> (uVar11 & 0x3f) & 1) != 0) {
          *(uint *)(lVar8 * local_50 + lVar7 + uVar11 * 4) = uVar4;
        }
        if ((puVar6[(long)(iVar12 * 2) + (long)iVar3 + uVar13] & 1L << ((byte)uVar11 & 0x3f)) != 0)
        {
          *(uint *)(lVar8 * lVar10 + lVar7 + uVar11 * 4) = uVar4;
        }
      }
    }
    pRVar15 = pRVar15 + 1;
    local_50 = local_50 + 2;
    lVar10 = lVar10 + 2;
  }
  if ((uVar2 & 1) != 0) {
    lVar10 = **(long **)&pMVar5->field_0x48;
    lVar7 = *(long *)&pMVar5->field_0x10;
    for (; uVar14 = (ulong)pRVar15->start_pos, uVar14 != 0xffff; pRVar15 = pRVar15 + 1) {
      uVar1 = pRVar15->end_pos;
      uVar4 = puVar9[pRVar15->label];
      for (; uVar14 < uVar1; uVar14 = uVar14 + 1) {
        *(uint *)((int)(uVar2 - 1) * lVar10 + lVar7 + uVar14 * 4) = uVar4;
      }
    }
  }
  return;
}

Assistant:

void SecondScan() {
        int w(img_.cols);
        int h(img_.rows);

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            const uint64_t* const data_u = data_compressed.bits + data_compressed.data_width * 2 * i;
            const uint64_t* const data_d = data_u + data_compressed.data_width;
            unsigned* const labels_u = img_labels_.ptr<unsigned>(2 * i);
            unsigned* const labels_d = img_labels_.ptr<unsigned>(2 * i + 1);

            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);

                for (int j = start_pos; j < end_pos; j++) {
                    if (data_u[j >> 6] & (1ull << (j & 0x3F))) labels_u[j] = label;
                    if (data_d[j >> 6] & (1ull << (j & 0x3F))) labels_d[j] = label;
                }
            }
        }
        if (h % 2) {
            unsigned* const labels = img_labels_.ptr<unsigned>(h - 1);
            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (int j = start_pos; j < end_pos; j++) {
                    labels[j] = label;
                }
            }
        }
    }